

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

bool __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
parseBinaryLiteral(Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                   *this)

{
  bool bVar1;
  UTF8Reader t;
  anon_class_1_0_00000001 local_19;
  UTF8Reader local_18;
  UTF8Reader local_10;
  
  local_18.data = (this->input).data;
  bVar1 = UTF8Reader::advanceIfStartsWith<char_const*>(&local_18,"0b","0B");
  if (bVar1) {
    local_10.data = local_18.data;
    bVar1 = Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
            ::
            parseIntegerWithBase<2,soul::Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>::parseBinaryLiteral()::_lambda(unsigned_int)_1_>
                      ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                        *)this,&local_10,&local_19);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool parseBinaryLiteral()
    {
        auto t = input;

        if (t.advanceIfStartsWith ("0b", "0B"))
            return parseIntegerWithBase<2> (t, [] (UnicodeChar c) -> int { return c == '0' ? 0 : (c == '1' ? 1 : -1); });

        return false;
    }